

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_iCCP(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  void *pvVar1;
  ulong in_RCX;
  uchar *in_RDX;
  size_t in_RSI;
  size_t *in_RDI;
  bool bVar2;
  uint string2_begin;
  uint length;
  size_t size;
  uint i;
  uint error;
  uint local_3c;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar4;
  
  uVar3 = 0;
  *(undefined4 *)(in_RDI + 0x1d) = 1;
  if (in_RDI[0x1e] != 0) {
    lodepng_clear_icc((LodePNGInfo *)0x167e51);
  }
  local_3c = 0;
  while( true ) {
    bVar2 = false;
    if (local_3c < in_RCX) {
      bVar2 = in_RDX[local_3c] != '\0';
    }
    if (!bVar2) break;
    local_3c = local_3c + 1;
  }
  if (local_3c + 2 < in_RCX) {
    if ((local_3c == 0) || (0x4f < local_3c)) {
      uVar4 = 0x59;
    }
    else {
      pvVar1 = lodepng_malloc(0x167ee4);
      in_RDI[0x1e] = (size_t)pvVar1;
      if (in_RDI[0x1e] == 0) {
        uVar4 = 0x53;
      }
      else {
        *(undefined1 *)(in_RDI[0x1e] + (ulong)local_3c) = 0;
        for (uVar4 = 0; uVar4 != local_3c; uVar4 = uVar4 + 1) {
          *(uchar *)(in_RDI[0x1e] + (ulong)uVar4) = in_RDX[uVar4];
        }
        if (in_RDX[local_3c + 1] == '\0') {
          if (in_RCX < local_3c + 2) {
            uVar4 = 0x4b;
          }
          else {
            uVar4 = zlib_decompress((uchar **)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    in_RDI,in_RSI,in_RDX,in_RCX,
                                    (LodePNGDecompressSettings *)CONCAT44(uVar3,uVar4));
            *(undefined4 *)(in_RDI + 0x20) = 0;
            if ((uVar4 == 0) && ((int)in_RDI[0x20] == 0)) {
              uVar4 = 100;
            }
          }
        }
        else {
          uVar4 = 0x48;
        }
      }
    }
  }
  else {
    uVar4 = 0x4b;
  }
  return uVar4;
}

Assistant:

static unsigned readChunk_iCCP(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
  const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  unsigned i;
  size_t size = 0;

  unsigned length, string2_begin;

  info->iccp_defined = 1;
  if (info->iccp_name) lodepng_clear_icc(info);

  for (length = 0; length < chunkLength && data[length] != 0; ++length);
  if (length + 2 >= chunkLength) return 75; /*no null termination, corrupt?*/
  if (length < 1 || length > 79) return 89; /*keyword too short or long*/

  info->iccp_name = (char*)lodepng_malloc(length + 1);
  if (!info->iccp_name) return 83; /*alloc fail*/

  info->iccp_name[length] = 0;
  for (i = 0; i != length; ++i) info->iccp_name[i] = (char)data[i];

  if (data[length + 1] != 0) return 72; /*the 0 byte indicating compression must be 0*/

  string2_begin = length + 2;
  if (string2_begin > chunkLength) return 75; /*no null termination, corrupt?*/

  length = (unsigned)chunkLength - string2_begin;
  error = zlib_decompress(&info->iccp_profile, &size, 0,
    &data[string2_begin],
    length, zlibsettings);
  info->iccp_profile_size = size;
  if (!error && !info->iccp_profile_size) error = 100; /*invalid ICC profile size*/
  return error;
}